

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReceptiveFieldDecodingSynapse.cpp
# Opt level: O3

void __thiscall
ReceptiveFieldDecodingSynapse::ReceptiveFieldDecodingSynapse
          (ReceptiveFieldDecodingSynapse *this,Population *n_from,Population *n_to)

{
  ReceptiveFieldDecodingSynapse_param *pRVar1;
  
  (this->super_Synapse)._vptr_Synapse = (_func_int **)&PTR_update_00122d60;
  pRVar1 = (ReceptiveFieldDecodingSynapse_param *)operator_new(0x28);
  pRVar1->window_length_s = 0.5;
  pRVar1->number_of_neurons = 10;
  *(undefined4 *)&pRVar1->input_min = 0;
  *(undefined4 *)((long)&pRVar1->input_min + 4) = 0;
  *(undefined4 *)&pRVar1->input_max = 0;
  *(undefined4 *)((long)&pRVar1->input_max + 4) = 0x3ff00000;
  pRVar1->delay_s = 0.0;
  this->param = pRVar1;
  (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  this->earliestSpike = false;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  initialize(this,n_from,n_to);
  return;
}

Assistant:

ReceptiveFieldDecodingSynapse::ReceptiveFieldDecodingSynapse(Population* n_from, Population* n_to) : 
    param(new ReceptiveFieldDecodingSynapse_param)
{
    initialize(n_from, n_to);
}